

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MethodPrototypeSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MethodPrototypeSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::SubroutineKind&,slang::ast::Visibility&,slang::bitmask<slang::ast::MethodFlags>&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          SubroutineKind *args_3,Visibility *args_4,bitmask<slang::ast::MethodFlags> *args_5)

{
  string_view name;
  MethodPrototypeSymbol *pMVar1;
  SourceLocation in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  undefined8 in_R8;
  bitmask<slang::ast::MethodFlags> flags;
  MethodPrototypeSymbol *in_R9;
  Visibility unaff_retaddr;
  size_t in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  flags.m_bits = (underlying_type)((ulong)in_R8 >> 0x30);
  pMVar1 = (MethodPrototypeSymbol *)
           allocate(in_stack_ffffffffffffffb8,
                    CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffa8);
  name._M_str = in_RSI;
  name._M_len = (size_t)in_RDX;
  ast::MethodPrototypeSymbol::MethodPrototypeSymbol
            (in_R9,(Compilation *)in_RDX[1],name,in_RCX,(SubroutineKind)((ulong)*in_RDX >> 0x20),
             unaff_retaddr,flags);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }